

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costSecondPartialDerivativeWRTControl
          (QuadraticLikeCost *this,double time,VectorDynSize *param_3,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ulong in_RCX;
  long in_RDI;
  double in_XMM0_Qa;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *hessian;
  bool isValid;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  *in_stack_fffffffffffff938;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff940;
  ostringstream *poVar9;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff948;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffff960;
  MatrixDynSize *in_stack_fffffffffffff968;
  StorageBaseType *in_stack_fffffffffffff980;
  double *in_stack_fffffffffffff988;
  string local_518 [32];
  ostringstream local_4f8 [376];
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  undefined8 local_40;
  byte local_31 [25];
  double local_18;
  byte local_1;
  
  local_18 = in_XMM0_Qa;
  uVar3 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize(in_RCX,uVar3);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x58));
  if (bVar1) {
    local_31[0] = 0;
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33fad8);
    iVar2 = (*peVar4->_vptr_TimeVaryingObject[2])(local_18,peVar4,local_31);
    local_40 = CONCAT44(extraout_var,iVar2);
    if ((local_31[0] & 1) == 0) {
      poVar9 = local_1b8;
      std::__cxx11::ostringstream::ostringstream(poVar9);
      poVar5 = std::operator<<((ostream *)poVar9,
                               "Unable to retrieve a valid control hessian at time: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
      std::operator<<(poVar5,".");
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",pcVar6);
      std::__cxx11::string::~string(local_1e8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      goto LAB_0033ff34;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::MatrixDynSize::cols();
    if (lVar7 != lVar8) {
      poVar9 = local_360;
      std::__cxx11::ostringstream::ostringstream(poVar9);
      poVar5 = std::operator<<((ostream *)poVar9,"The control hessian at time: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
      std::operator<<(poVar5," is not squared.");
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",pcVar6);
      std::__cxx11::string::~string(local_380);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_360);
      goto LAB_0033ff34;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 != lVar8) {
      poVar9 = local_4f8;
      std::__cxx11::ostringstream::ostringstream(poVar9);
      poVar5 = std::operator<<((ostream *)poVar9,"The hessian at time: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
      std::operator<<(poVar5," does not match the control dimension.");
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",pcVar6);
      std::__cxx11::string::~string(local_518);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_4f8);
      goto LAB_0033ff34;
    }
    toEigen(in_stack_fffffffffffff968);
    toEigen(in_stack_fffffffffffff968);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::transpose(in_stack_fffffffffffff948);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
    operator+((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    Eigen::operator*(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    toEigen(in_stack_fffffffffffff968);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  }
  else {
    iDynTree::MatrixDynSize::zero();
  }
  local_1 = 1;
LAB_0033ff34:
  return (bool)(local_1 & 1);
}

Assistant:

bool QuadraticLikeCost::costSecondPartialDerivativeWRTControl(double time,
                                                                  const iDynTree::VectorDynSize& /*state*/,
                                                                  const iDynTree::VectorDynSize& control,
                                                                  iDynTree::MatrixDynSize& partialDerivative)
        {
            partialDerivative.resize(control.size(), control.size());

            if (m_timeVaryingControlHessian) {

                bool isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) = 0.5 * (toEigen(hessian) + toEigen(hessian).transpose());
            } else {
                partialDerivative.zero();
            }
            return true;
        }